

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O0

void __thiscall
Assimp::OptimizeGraphProcess::SetupProperties(OptimizeGraphProcess *this,Importer *pImp)

{
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string tmp;
  Importer *pImp_local;
  OptimizeGraphProcess *this_local;
  
  tmp.field_2._8_8_ = pImp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  Importer::GetPropertyString((string *)local_38,pImp,"PP_OG_EXCLUDE_LIST",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  AddLockedNodeList(this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void OptimizeGraphProcess::SetupProperties(const Importer* pImp) {
    // Get value of AI_CONFIG_PP_OG_EXCLUDE_LIST
    std::string tmp = pImp->GetPropertyString(AI_CONFIG_PP_OG_EXCLUDE_LIST,"");
    AddLockedNodeList(tmp);
}